

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widgets.cpp
# Opt level: O0

bool check_max_min(Am_Value *result,Am_Object *widget,bool want_db)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  long mini;
  long maxi;
  float minf;
  float maxf;
  undefined1 local_48 [8];
  Am_Value v2;
  Am_Value v1;
  bool want_db_local;
  Am_Object *widget_local;
  Am_Value *result_local;
  
  pAVar1 = Am_Object::Get(widget,0x181,0);
  Am_Value::Am_Value((Am_Value *)&v2.value,pAVar1);
  pAVar1 = Am_Object::Get(widget,0x182,0);
  Am_Value::Am_Value((Am_Value *)local_48,pAVar1);
  if ((v2.value.long_value._0_2_ == local_48._0_2_) &&
     ((((v2.value.long_value._0_2_ == 5 || (v2.value.long_value._0_2_ == 3)) ||
       (v2.value.long_value._0_2_ == -0x7ffa)) ||
      ((v2.value.long_value._0_2_ == 2 || (v2.value.long_value._0_2_ == 0)))))) {
    if ((v2.value.long_value._0_2_ == 3) || (v2.value.long_value._0_2_ == 2)) {
      mini = Am_Value::operator_cast_to_long((Am_Value *)&v2.value);
      maxi = Am_Value::operator_cast_to_long((Am_Value *)local_48);
      result_local._7_1_ = icheck_max_min(result,mini,maxi,want_db,widget);
    }
    else if ((v2.value.long_value._0_2_ == 5) || (v2.value.long_value._0_2_ == -0x7ffa)) {
      minf = Am_Value::operator_cast_to_float((Am_Value *)&v2.value);
      maxf = Am_Value::operator_cast_to_float((Am_Value *)local_48);
      result_local._7_1_ = fcheck_max_min(result,minf,maxf,want_db,widget);
    }
    else {
      result_local._7_1_ = true;
    }
    Am_Value::~Am_Value((Am_Value *)local_48);
    Am_Value::~Am_Value((Am_Value *)&v2.value);
    return result_local._7_1_;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar2 = std::operator<<(poVar2,"Am_VALUE_1 and Am_VALUE_2 of ");
  poVar2 = operator<<(poVar2,widget);
  poVar2 = std::operator<<(poVar2,
                           " must be int, long, float, double, or Am_No_Value,  and the same type, but they are "
                          );
  poVar2 = operator<<(poVar2,(Am_Value *)&v2.value);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = operator<<(poVar2,(Am_Value *)local_48);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Am_Error();
}

Assistant:

bool
check_max_min(Am_Value result, Am_Object &widget, bool want_db)
{
  Am_Value v1 = widget.Get(Am_VALUE_1);
  Am_Value v2 = widget.Get(Am_VALUE_2);
  if (!(v1.type == v2.type &&
        (v1.type == Am_FLOAT || v1.type == Am_LONG || v1.type == Am_DOUBLE ||
         v1.type == Am_INT || v1.type == Am_NONE)))
    Am_ERRORO("Am_VALUE_1 and Am_VALUE_2 of "
                  << widget
                  << " must be int, long, float, double, or Am_No_Value, "
                     " and the same type, but they are "
                  << v1 << " and " << v2,
              widget, Am_VALUE_1);
  if (v1.type == Am_LONG || v1.type == Am_INT)
    return icheck_max_min(result, v1, v2, want_db, widget);
  else if (v1.type == Am_FLOAT || v1.type == Am_DOUBLE)
    return fcheck_max_min(result, v1, v2, want_db, widget);
  return true;
}